

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astopt.cpp
# Opt level: O2

int main(int argc,char **argsv)

{
  undefined1 auVar1 [8];
  Lexer *pLVar2;
  bool bVar3;
  ostream *poVar4;
  int iVar5;
  LanguageConfiguration cfg;
  undefined1 local_320 [8];
  size_t reducedexpressions;
  Lexer *local_310;
  Logger log;
  Parser parser;
  Lexer lex;
  istringstream input;
  
  iVar5 = 1;
  if ((argc == 2) && (*argsv[1] != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&lex,argsv[1],(allocator<char> *)&parser);
    std::__cxx11::istringstream::istringstream((istringstream *)&input,(string *)&lex,_S_in);
    std::__cxx11::string::~string((string *)&lex);
    cfg.multiLineString = false;
    cfg.multiLineStringLeftTrim = true;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&parser,"<args[1]>",(allocator<char> *)&log);
    pfederc::Lexer::Lexer(&lex,&cfg,(istream *)&input,(string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
    pfederc::BaseLogger::BaseLogger
              ((BaseLogger *)&parser,(ostream *)&std::cout,(ostream *)&std::cerr);
    pfederc::Logger::Logger
              (&log,LVL_FAILURE|LVL_FATAL|LVL_HELP|LVL_NOTE|LVL_ERROR|LVL_WARNING,
               (BaseLogger *)&parser);
    pfederc::BaseLogger::~BaseLogger((BaseLogger *)&parser);
    pfederc::Lexer::next(&lex);
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    parser.errors.
    super__Vector_base<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>,_std::allocator<std::unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    parser.descriptions._M_t._M_impl._0_8_ = 0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    parser.lexer = &lex;
    parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         parser.descriptions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    pfederc::Parser::parseExpression((Parser *)local_320,(Precedence)&parser);
    bVar3 = pfederc::logLexerErrors(&log,&lex);
    iVar5 = 1;
    if (!bVar3) {
      if (local_320 == (undefined1  [8])0x0) {
        poVar4 = std::operator<<((ostream *)&std::cout,"ERR");
        std::endl<char,std::char_traits<char>>(poVar4);
        pfederc::logParserErrors(&log,&parser);
      }
      else {
        bVar3 = pfederc::logParserErrors(&log,&parser);
        if (!bVar3) {
          reducedexpressions = 0;
          pfederc::optimizeAll
                    ((pfederc *)&local_310,
                     (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_320,
                     &reducedexpressions);
          pLVar2 = local_310;
          auVar1 = local_320;
          local_310 = (Lexer *)0x0;
          local_320 = (undefined1  [8])pLVar2;
          if ((__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)auVar1 !=
              (__uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)0x0) {
            (**(code **)(*(long *)auVar1 + 8))();
            if (local_310 != (Lexer *)0x0) {
              (*local_310->_vptr_Lexer[1])();
            }
          }
          (*(*(_func_int ***)local_320)[2])((string *)&local_310);
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&local_310);
          std::endl<char,std::char_traits<char>>(poVar4);
          std::__cxx11::string::~string((string *)&local_310);
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::endl<char,std::char_traits<char>>(poVar4);
          iVar5 = 0;
        }
      }
    }
    if (local_320 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_320 + 8))();
    }
    pfederc::Parser::~Parser(&parser);
    pfederc::Logger::~Logger(&log);
    pfederc::Lexer::~Lexer(&lex);
    std::__cxx11::istringstream::~istringstream((istringstream *)&input);
  }
  return iVar5;
}

Assistant:

int main(int argc, char * argsv[]) {
  if (argc != 2 || strlen(argsv[1]) == 0)
    return 1;

  std::istringstream input(argsv[1]);
  LanguageConfiguration cfg = createDefaultLanguageConfiguration();
  Lexer lex(cfg, input, "<args[1]>");

  Logger log;
  
  lex.next();
  Parser parser(lex);
  auto expr = parser.parseExpression();

  if (logLexerErrors(log, lex))
    return 1;

  if (!expr) {
    std::cout << "ERR" << std::endl;
    logParserErrors(log, parser);
    return 1;
  }

  if (logParserErrors(log, parser))
    return 1;

  size_t reducedexpressions{0};
  expr = optimizeAll(std::move(expr), reducedexpressions);

  std::cout << expr->toString() << std::endl;
  std::cout << reducedexpressions << std::endl;

  return 0;
}